

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.h
# Opt level: O2

char * __thiscall
google::protobuf::internal::EpsCopyInputStream::ReadPackedFixed<unsigned_int>
          (EpsCopyInputStream *this,char *ptr,int size,RepeatedField<unsigned_int> *out)

{
  uint uVar1;
  int iVar2;
  pointer puVar3;
  char *pcVar4;
  LogMessage *pLVar5;
  int n;
  RepeatedField<unsigned_int> *out_local;
  LogMessage local_40;
  
  if (ptr == (char *)0x0) {
LAB_0037a778:
    pcVar4 = (char *)0x0;
  }
  else {
    out_local = out;
    uVar1 = BytesAvailable(this,ptr);
    while ((int)uVar1 < size) {
      iVar2 = RepeatedField<unsigned_int>::size(out);
      RepeatedField<unsigned_int>::Reserve(out,iVar2 + ((int)uVar1 >> 2));
      puVar3 = RepeatedField<unsigned_int>::AddNAlreadyReserved(out,(int)uVar1 >> 2);
      memcpy(puVar3,ptr,(long)(int)(uVar1 & 0xfffffffc));
      if ((this->limit_ < 0x11) || (pcVar4 = Next(this), pcVar4 == (char *)0x0)) goto LAB_0037a778;
      size = size - (uVar1 & 0xfffffffc);
      ptr = pcVar4 + (0x10 - (uVar1 & 3));
      uVar1 = BytesAvailable(this,ptr);
    }
    uVar1 = size & 0xfffffffc;
    if (3 < (uint)size) {
      n = size >> 2;
      iVar2 = RepeatedField<unsigned_int>::size(out);
      RepeatedField<unsigned_int>::Reserve(out,iVar2 + n);
      puVar3 = RepeatedField<unsigned_int>::AddNAlreadyReserved(out,n);
      if (puVar3 == (pointer)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_40,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/parse_context.h"
                   ,0x4ea,"dst != nullptr");
        pLVar5 = absl::lts_20250127::log_internal::LogMessage::
                 operator<<<google::protobuf::RepeatedField<unsigned_int>_*,_0>
                           (&local_40,&out_local);
        pLVar5 = absl::lts_20250127::log_internal::LogMessage::operator<<
                           (pLVar5,(char (*) [2])0x54fb72);
        absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar5,n);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_40);
      }
      memcpy(puVar3,ptr,(long)(int)uVar1);
      ptr = ptr + (int)uVar1;
    }
    pcVar4 = (char *)0x0;
    if (size == uVar1) {
      pcVar4 = ptr;
    }
  }
  return pcVar4;
}

Assistant:

const char* EpsCopyInputStream::ReadPackedFixed(const char* ptr, int size,
                                                RepeatedField<T>* out) {
  GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
  int nbytes = BytesAvailable(ptr);
  while (size > nbytes) {
    int num = nbytes / sizeof(T);
    int old_entries = out->size();
    out->Reserve(old_entries + num);
    int block_size = num * sizeof(T);
    auto dst = out->AddNAlreadyReserved(num);
#ifdef ABSL_IS_LITTLE_ENDIAN
    std::memcpy(dst, ptr, block_size);
#else
    for (int i = 0; i < num; i++)
      dst[i] = UnalignedLoad<T>(ptr + i * sizeof(T));
#endif
    size -= block_size;
    if (limit_ <= kSlopBytes) return nullptr;
    ptr = Next();
    if (ptr == nullptr) return nullptr;
    ptr += kSlopBytes - (nbytes - block_size);
    nbytes = BytesAvailable(ptr);
  }
  int num = size / sizeof(T);
  int block_size = num * sizeof(T);
  if (num == 0) return size == block_size ? ptr : nullptr;
  int old_entries = out->size();
  out->Reserve(old_entries + num);
  auto dst = out->AddNAlreadyReserved(num);
#ifdef ABSL_IS_LITTLE_ENDIAN
  ABSL_CHECK(dst != nullptr) << out << "," << num;
  std::memcpy(dst, ptr, block_size);
#else
  for (int i = 0; i < num; i++) dst[i] = UnalignedLoad<T>(ptr + i * sizeof(T));
#endif
  ptr += block_size;
  if (size != block_size) return nullptr;
  return ptr;
}